

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_bspline.cpp
# Opt level: O0

int __thiscall agg::bspline::init(bspline *this,EVP_PKEY_CTX *ctx)

{
  double *in_RCX;
  double *in_RDX;
  int local_2c;
  double *pdStack_28;
  int i;
  double *y_local;
  double *x_local;
  int num_local;
  bspline *this_local;
  
  if (2 < (int)ctx) {
    init(this,(EVP_PKEY_CTX *)((ulong)ctx & 0xffffffff));
    pdStack_28 = in_RCX;
    y_local = in_RDX;
    for (local_2c = 0; local_2c < (int)ctx; local_2c = local_2c + 1) {
      add_point(this,*y_local,*pdStack_28);
      pdStack_28 = pdStack_28 + 1;
      y_local = y_local + 1;
    }
    prepare(this);
  }
  this->m_last_idx = -1;
  return (int)this;
}

Assistant:

void bspline::init(int num, const double* x, const double* y)
    {
        if(num > 2)
        {
            init(num);
            int i;
            for(i = 0; i < num; i++)
            {
                add_point(*x++, *y++);
            }
            prepare();
        }
        m_last_idx = -1;
    }